

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscr_storage_map_based.cpp
# Opt level: O2

void __thiscall
so_5::impl::map_based_subscr_storage::storage_t::destroy_all_subscriptions(storage_t *this)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  bool bVar3;
  _Base_ptr p_Var4;
  agent_t *paVar5;
  _Self __tmp;
  iterator __position;
  undefined8 local_40;
  _Base_ptr *local_38;
  
  p_Var1 = &(this->m_events)._M_t._M_impl.super__Rb_tree_header;
  __position._M_node = (this->m_events)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)__position._M_node == p_Var1) {
      return;
    }
    p_Var4 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
    if ((_Rb_tree_header *)p_Var4 == p_Var1) {
LAB_00246ee7:
      p_Var2 = __position._M_node[1]._M_right;
      paVar5 = subscription_storage_t::owner(&this->super_subscription_storage_t);
      (**(code **)(*(long *)p_Var2 + 0x20))(p_Var2,&__position._M_node[1]._M_parent,paVar5);
    }
    else {
      local_40 = *(undefined8 *)(__position._M_node + 1);
      local_38 = &__position._M_node[1]._M_parent;
      bVar3 = (anonymous_namespace)::is_same_mbox_msg::operator()
                        ((is_same_mbox_msg *)&local_40,(key_t *)(p_Var4 + 1));
      if (!bVar3) goto LAB_00246ee7;
    }
    std::
    _Rb_tree<so_5::impl::map_based_subscr_storage::storage_t::key_t,std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>,std::_Select1st<std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>>,std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,std::allocator<std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>>>
    ::erase_abi_cxx11_((_Rb_tree<so_5::impl::map_based_subscr_storage::storage_t::key_t,std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>,std::_Select1st<std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>>,std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,std::allocator<std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>>>
                        *)&this->m_events,__position);
    __position._M_node = p_Var4;
  } while( true );
}

Assistant:

void
storage_t::destroy_all_subscriptions()
	{
		using namespace std;

		auto it = begin( m_events );
		while( it != end( m_events ) )
			{
				auto cur = it++;

				if( it == end( m_events ) || !is_same_mbox_msg{
						cur->first.m_mbox_id,
						cur->first.m_msg_type }( it->first ) )
					{
						cur->second.m_mbox->unsubscribe_event_handlers(
								cur->first.m_msg_type,
								owner() );
					}

				m_events.erase( cur );
			}
	}